

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

FillLikeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::FillLikeLayerParams>
          (Arena *arena)

{
  FillLikeLayerParams *pFVar1;
  
  if (arena != (Arena *)0x0) {
    pFVar1 = DoCreateMessage<CoreML::Specification::FillLikeLayerParams>(arena);
    return pFVar1;
  }
  pFVar1 = (FillLikeLayerParams *)operator_new(0x18);
  CoreML::Specification::FillLikeLayerParams::FillLikeLayerParams(pFVar1,(Arena *)0x0,false);
  return pFVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }